

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs_impl::path_cs_ext::path_info>::~holder
          (holder<cs_impl::path_cs_ext::path_info> *this)

{
  ~holder(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~ holder() override = default;